

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::replaceLaneI32x4
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  undefined3 in_register_00000009;
  long lVar1;
  Type *this_00;
  undefined1 local_80 [8];
  LaneArray<4> lanes;
  
  getLanes<int,4>((LaneArray<4> *)local_80,(wasm *)this,other);
  if (index < 4) {
    this_00 = &lanes._M_elems[(ulong)CONCAT31(in_register_00000009,index) - 1].type;
    if ((Literal *)this_00 != other) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,other);
    }
    Literal(__return_storage_ptr__,(LaneArray<4> *)local_80);
    lVar1 = 0x48;
    do {
      ~Literal((Literal *)(local_80 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("array::at: __n (which is %zu) >= _Nm (which is %zu)",
             (ulong)CONCAT31(in_register_00000009,index),4);
}

Assistant:

Literal Literal::replaceLaneI32x4(const Literal& other, uint8_t index) const {
  return replace<4, &Literal::getLanesI32x4>(*this, other, index);
}